

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_test.c
# Opt level: O3

void test_resize(void)

{
  nng_err nVar1;
  long lVar2;
  char *pcVar3;
  nng_err result_;
  nng_err result__1;
  int *val;
  uint64_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int local_1068 [2];
  int expect [1024];
  nni_id_map m;
  
  iVar5 = 0;
  iVar6 = 1;
  iVar7 = 2;
  iVar8 = 3;
  lVar2 = 0;
  do {
    local_1068[lVar2] = iVar5;
    expect[lVar2 + -1] = iVar6;
    expect[lVar2] = iVar7;
    expect[lVar2 + 1] = iVar8;
    lVar2 = lVar2 + 4;
    iVar5 = iVar5 + 4;
    iVar6 = iVar6 + 4;
    iVar7 = iVar7 + 4;
    iVar8 = iVar8 + 4;
  } while (lVar2 != 0x400);
  nni_id_map_init((nni_id_map *)(expect + 0x3fe),0,0,false);
  val = local_1068;
  uVar4 = 0;
  do {
    nVar1 = nni_id_set((nni_id_map *)(expect + 0x3fe),uVar4,val);
    if (nVar1 != NNG_OK) {
      pcVar3 = nng_strerror(nVar1);
      iVar5 = acutest_check_(0,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                             ,0x7b,"%s: expected success, got %s (%d)","rv",pcVar3,nVar1);
      if (iVar5 == 0) goto LAB_0010c2cb;
    }
    uVar4 = uVar4 + 1;
    val = val + 1;
  } while (uVar4 != 0x400);
  uVar4 = 0;
  do {
    nVar1 = nni_id_remove((nni_id_map *)(expect + 0x3fe),uVar4);
    if (nVar1 != NNG_OK) {
      pcVar3 = nng_strerror(nVar1);
      iVar5 = acutest_check_(0,
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/id_test.c"
                             ,0x81,"%s: expected success, got %s (%d)","rv",pcVar3,nVar1);
      if (iVar5 == 0) {
LAB_0010c2cb:
        acutest_abort_();
      }
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x400) {
      nni_id_map_fini((nni_id_map *)(expect + 0x3fe));
      return;
    }
  } while( true );
}

Assistant:

void
test_resize(void)
{
	nni_id_map m;
	int        rv;
	int        i;
	int        expect[1024];

	for (i = 0; i < 1024; i++) {
		expect[i] = i;
	}

	nni_id_map_init(&m, 0, 0, false);

	for (i = 0; i < 1024; i++) {
		if ((rv = nni_id_set(&m, i, &expect[i])) != 0) {
			NUTS_PASS(rv);
		}
	}

	for (i = 0; i < 1024; i++) {
		if ((rv = nni_id_remove(&m, i)) != 0) {
			NUTS_PASS(rv);
		}
	}
	nni_id_map_fini(&m);
}